

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O1

void tb_invalidate_phys_page_fast_x86_64
               (uc_struct_conflict *uc,page_collection *pages,tb_page_addr_t start,int len,
               uintptr_t retaddr)

{
  ulong uVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  PageDesc *p;
  unsigned_long *puVar5;
  
  p = page_find_alloc(uc,start >> 0xc,0);
  if (p != (PageDesc *)0x0) {
    if ((p->code_bitmap == (unsigned_long *)0x0) &&
       (uVar3 = p->code_write_count + 1, p->code_write_count = uVar3, 9 < uVar3)) {
      puVar5 = (unsigned_long *)g_try_malloc0(0x200);
      if (puVar5 == (unsigned_long *)0x0) {
        abort();
      }
      p->code_bitmap = puVar5;
      for (uVar1 = p->first_tb; puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffe),
          puVar2 != (undefined8 *)0x0; uVar1 = puVar2[(ulong)((uint)uVar1 & 1) + 7]) {
        if ((uVar1 & 1) == 0) {
          uVar4 = (uint)*puVar2 & 0xfff;
          uVar3 = *(ushort *)((long)puVar2 + 0x14) + uVar4;
          if (0xfff < uVar3) {
            uVar3 = 0x1000;
          }
        }
        else {
          uVar4 = 0;
          uVar3 = (uint)*puVar2 + *(int *)((long)puVar2 + 0x14) & 0xfff;
        }
        qemu_bitmap_set(p->code_bitmap,(ulong)uVar4,(long)(int)(uVar3 - uVar4));
      }
    }
    if ((p->code_bitmap == (unsigned_long *)0x0) ||
       (((uint)(*(ulong *)((long)p->code_bitmap + (ulong)((uint)(start >> 3) & 0x1f8)) >>
               ((byte)start & 0x3f)) & ~(-1 << ((byte)len & 0x1f))) != 0)) {
      tb_invalidate_phys_page_range__locked(uc,pages,p,start,(long)len + start,retaddr);
      return;
    }
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_fast(struct uc_struct *uc, struct page_collection *pages,
                                  tb_page_addr_t start, int len,
                                  uintptr_t retaddr)
{
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (!p) {
        return;
    }

    assert_page_locked(p);
    if (!p->code_bitmap &&
        ++p->code_write_count >= SMC_BITMAP_USE_THRESHOLD) {
        build_page_bitmap(uc, p);
    }
    if (p->code_bitmap) {
        unsigned int nr;
        unsigned long b;

        nr = start & ~TARGET_PAGE_MASK;
        b = p->code_bitmap[BIT_WORD(nr)] >> (nr & (BITS_PER_LONG - 1));
        if (b & ((1 << len) - 1)) {
            goto do_invalidate;
        }
    } else {
    do_invalidate:
        tb_invalidate_phys_page_range__locked(uc, pages, p, start, start + len,
                                              retaddr);
    }
}